

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

void __thiscall
APhyBullet::BulletWorldDebugDrawer::drawTriangle
          (BulletWorldDebugDrawer *this,btVector3 *v0,btVector3 *v1,btVector3 *v2,btVector3 *color,
          btScalar alpha)

{
  putOpcode(this,APHY_DEBUG_DRAW_OP_TRIANGLE_FLAT);
  putVector3(this,v0);
  putVector3(this,v1);
  putVector3(this,v2);
  putVector3(this,color);
  putScalar(this,alpha);
  return;
}

Assistant:

virtual	void drawTriangle(const btVector3& v0,const btVector3& v1,const btVector3& v2,const btVector3& color, btScalar alpha) override
    {
        putOpcode(APHY_DEBUG_DRAW_OP_TRIANGLE_FLAT);
        putVector3(v0);
        putVector3(v1);
        putVector3(v2);
        putVector3(color);
        putScalar(alpha);
    }